

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

SNode * goto_PNode(Parser *p,d_loc_t *loc,PNode *pn,SNode *ps)

{
  uint uVar1;
  uint32 uVar2;
  SNode *sn;
  D_RightEpsilonHint *pDVar3;
  SNode *sn_00;
  Reduction *pRVar4;
  Reduction *r;
  D_RightEpsilonHint *h;
  uint state_index;
  uint k;
  uint j;
  uint i;
  D_State *state;
  ZNode *z;
  SNode *pre_ps;
  SNode *new_ps;
  SNode *ps_local;
  PNode *pn_local;
  d_loc_t *loc_local;
  Parser *p_local;
  
  if (((uint)ps->state->goto_valid[(pn->parse_node).symbol / 8] &
      1 << ((byte)((long)(pn->parse_node).symbol % 8) & 0x1f)) == 0) {
    return (SNode *)0x0;
  }
  sn = add_SNode(p,p->t->state +
                   (p->t->goto_table[(pn->parse_node).symbol - ps->state->goto_table_offset] - 1),
                 loc,(pn->parse_node).scope);
  if ((sn->last_pn != (PNode *)0x0) &&
     (uVar2 = sn->last_pn->refcount - 1, sn->last_pn->refcount = uVar2, uVar2 == 0)) {
    free_PNode(p,sn->last_pn);
  }
  pn->refcount = pn->refcount + 1;
  sn->last_pn = pn;
  if ((ps != sn) &&
     ((int)(*(uint *)&sn->field_0x24 & 0x7fffffff) <
      (int)((*(uint *)&ps->field_0x24 & 0x7fffffff) + 1))) {
    *(uint *)&sn->field_0x24 =
         *(uint *)&sn->field_0x24 & 0x80000000 |
         (*(uint *)&ps->field_0x24 & 0x7fffffff) + 1 & 0x7fffffff;
  }
  state = (D_State *)set_find_znode(&sn->zns,pn);
  if (state == (D_State *)0x0) {
    state = (D_State *)new_ZNode(p,pn);
    set_add_znode(&sn->zns,(ZNode *)state);
    for (state_index = 0; state_index < (sn->state->reductions).n; state_index = state_index + 1) {
      if ((sn->state->reductions).v[state_index]->nelements != 0) {
        add_Reduction(p,(ZNode *)state,sn,(sn->state->reductions).v[state_index]);
      }
    }
    if (pn->shift == (D_Shift *)0x0) {
      for (state_index = 0; state_index < (sn->state->right_epsilon_hints).n;
          state_index = state_index + 1) {
        pDVar3 = (sn->state->right_epsilon_hints).v + state_index;
        sn_00 = find_SNode(p,(uint)pDVar3->preceeding_state,sn->initial_scope);
        if (sn_00 != (SNode *)0x0) {
          for (h._4_4_ = 0; h._4_4_ < (sn_00->zns).n; h._4_4_ = h._4_4_ + 1) {
            if (((sn_00->zns).v[h._4_4_] != (ZNode *)0x0) &&
               (pRVar4 = add_Reduction(p,(sn_00->zns).v[h._4_4_],sn_00,
                                       (D_Reduction *)pDVar3->reduction), pRVar4 != (Reduction *)0x0
               )) {
              pRVar4->new_snode = sn;
              pRVar4->new_depth = (uint)pDVar3->depth;
            }
          }
        }
      }
    }
  }
  k = 0;
  while ((k < (uint)state->goto_table_offset &&
         (*(SNode **)(*(long *)&state->reductions + (ulong)k * 8) != ps))) {
    k = k + 1;
  }
  if (k < (uint)state->goto_table_offset) {
    return sn;
  }
  if (*(long *)&state->reductions == 0) {
    *(D_Reduction ****)&state->reductions = &(state->reductions).v;
    uVar1 = state->goto_table_offset;
    state->goto_table_offset = uVar1 + 1;
    (&(state->reductions).v)[uVar1] = (D_Reduction **)ps;
  }
  else {
    if ((D_Reduction ***)*(undefined1 **)&state->reductions == &(state->reductions).v) {
      if ((uint)state->goto_table_offset < 3) {
        uVar1 = state->goto_table_offset;
        state->goto_table_offset = uVar1 + 1;
        *(SNode **)(*(long *)&state->reductions + (ulong)uVar1 * 8) = ps;
        goto LAB_00157ac9;
      }
    }
    else if ((state->goto_table_offset & 7U) != 0) {
      uVar1 = state->goto_table_offset;
      state->goto_table_offset = uVar1 + 1;
      *(SNode **)(*(long *)&state->reductions + (ulong)uVar1 * 8) = ps;
      goto LAB_00157ac9;
    }
    vec_add_internal(&state->goto_table_offset,ps);
  }
LAB_00157ac9:
  if (sn != ps) {
    ps->refcount = ps->refcount + 1;
  }
  return sn;
}

Assistant:

static SNode *goto_PNode(Parser *p, d_loc_t *loc, PNode *pn, SNode *ps) {
  SNode *new_ps, *pre_ps;
  ZNode *z = NULL;
  D_State *state;
  uint i, j, k, state_index;

  if (!IS_BIT_SET(ps->state->goto_valid, pn->parse_node.symbol)) return NULL;
  state_index = GOTO_STATE(p, pn, ps);
  state = &p->t->state[state_index];
  new_ps = add_SNode(p, state, loc, pn->parse_node.scope);
  if (new_ps->last_pn) unref_pn(p, new_ps->last_pn);
  ref_pn(pn);
  new_ps->last_pn = pn;

  DBG(printf("goto %d (%s) -> %d %p\n", (int)(ps->state - p->t->state), p->t->symbols[pn->parse_node.symbol].name,
             state_index, (void *)new_ps));
  if (ps != new_ps && new_ps->depth < ps->depth + 1) new_ps->depth = ps->depth + 1;
  /* find/create ZNode */
  z = set_find_znode(&new_ps->zns, pn);
  if (!z) { /* not found */
    set_add_znode(&new_ps->zns, (z = new_ZNode(p, pn)));
    for (j = 0; j < new_ps->state->reductions.n; j++)
      if (new_ps->state->reductions.v[j]->nelements) add_Reduction(p, z, new_ps, new_ps->state->reductions.v[j]);
    if (!pn->shift)
      for (j = 0; j < new_ps->state->right_epsilon_hints.n; j++) {
        D_RightEpsilonHint *h = &new_ps->state->right_epsilon_hints.v[j];
        pre_ps = find_SNode(p, h->preceeding_state, new_ps->initial_scope);
        if (!pre_ps) continue;
        for (k = 0; k < pre_ps->zns.n; k++)
          if (pre_ps->zns.v[k]) {
            Reduction *r = add_Reduction(p, pre_ps->zns.v[k], pre_ps, h->reduction);
            if (r) {
              r->new_snode = new_ps;
              r->new_depth = h->depth;
            }
          }
      }
  }
  for (i = 0; i < z->sns.n; i++)
    if (z->sns.v[i] == ps) break;
  if (i >= z->sns.n) { /* not found */
    vec_add(&z->sns, ps);
    if (new_ps != ps) ref_sn(ps);
  }
  return new_ps;
}